

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

size_t aesgcm_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,void *iv,
                     void *aad,size_t aadlen)

{
  int iVar1;
  size_t sVar2;
  aesgcm_context_t *ctx;
  
  sVar2 = 0xffffffffffffffff;
  if (0xf < inlen) {
    iVar1 = cf_gcm_decrypt(&cf_aes,_ctx + 1,(uint8_t *)input,inlen - 0x10,(uint8_t *)aad,aadlen,
                           (uint8_t *)iv,0xc,(uint8_t *)((long)input + (inlen - 0x10)),0x10,
                           (uint8_t *)output);
    sVar2 = -(ulong)(iVar1 != 0) | inlen - 0x10;
  }
  return sVar2;
}

Assistant:

static size_t aesgcm_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, const void *iv,
                             const void *aad, size_t aadlen)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;

    if (inlen < PTLS_AESGCM_TAG_SIZE)
        return SIZE_MAX;
    size_t tag_offset = inlen - PTLS_AESGCM_TAG_SIZE;

    if (cf_gcm_decrypt(&cf_aes, &ctx->aes, input, tag_offset, aad, aadlen, iv, PTLS_AESGCM_IV_SIZE, (uint8_t *)input + tag_offset,
                       PTLS_AESGCM_TAG_SIZE, output) != 0)
        return SIZE_MAX;

    return tag_offset;
}